

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_set::build_graph(test_set *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ulong uVar2;
  ggml_tensor *pgVar3;
  ulong uVar4;
  long lVar5;
  array<long,_4UL> ne_dst;
  
  pgVar1 = test_case::ggml_new_tensor
                     (&this->super_test_case,ctx,this->type_src,4,(this->ne)._M_elems);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"src");
  ne_dst._M_elems[2] = (this->ne)._M_elems[2];
  ne_dst._M_elems[3] = (this->ne)._M_elems[3];
  ne_dst._M_elems[0] = (this->ne)._M_elems[0];
  ne_dst._M_elems[1] = (this->ne)._M_elems[1];
  uVar4 = 0;
  uVar2 = (ulong)(uint)this->dim;
  if (this->dim < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    ne_dst._M_elems[uVar4] = ne_dst._M_elems[uVar4] << 1;
  }
  pgVar3 = test_case::ggml_new_tensor(&this->super_test_case,ctx,this->type_dst,4,ne_dst._M_elems);
  ggml_set_param(ctx,pgVar3);
  ggml_set_name();
  uVar4 = 0;
  uVar2 = (ulong)(uint)this->dim;
  if (this->dim < 1) {
    uVar2 = uVar4;
  }
  lVar5 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    lVar5 = lVar5 + ((ne_dst._M_elems[uVar4] - (this->ne)._M_elems[uVar4]) / 2) * pgVar3->nb[uVar4];
  }
  pgVar1 = (ggml_tensor *)
           ggml_set(ctx,pgVar3,pgVar1,pgVar1->nb[1],pgVar1->nb[2],pgVar1->nb[3],lVar5);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * src = ggml_new_tensor(ctx, type_src, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        auto ne_dst = ne;
        for (int i = 0; i < dim; ++i) {
            ne_dst[i] *= 2;
        }
        ggml_tensor* dst = ggml_new_tensor(ctx, type_dst, 4, ne_dst.data());
        ggml_set_param(ctx, dst);
        ggml_set_name(dst, "dst");

        size_t offset = 0;
        for (int i = 0; i < dim; ++i) {
            offset += ((ne_dst[i] - ne[i])/2)*dst->nb[i];
        }
        ggml_tensor * out = ggml_set(ctx, dst, src,
            // The backward pass requires setting a contiguous region:
            src->nb[1], src->nb[2], src->nb[3], offset);
        ggml_set_name(out, "out");

        return out;
    }